

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O2

int __thiscall CAPSFile::WriteToBuffer(CAPSFile *this,uchar *buffer,uint size_of_buffer)

{
  uchar *puVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  pointer paVar5;
  pointer __src;
  int iVar6;
  long lVar7;
  
  uVar3 = (*this->_vptr_CAPSFile[5])();
  if (size_of_buffer < uVar3) {
    iVar6 = -1;
  }
  else {
    uVar3 = (this->caps_header_).length;
    uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    memcpy(buffer,&this->caps_header_,(long)(int)uVar4);
    uVar3 = (this->caps_info_).header.length;
    uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    memcpy(buffer + (int)uVar4,&this->caps_info_,(long)(int)uVar3);
    iVar6 = uVar3 + uVar4;
    for (__src = (this->list_imge_).
                 super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl
                 .super__Vector_impl_data._M_start;
        __src != (this->list_imge_).
                 super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl
                 .super__Vector_impl_data._M_finish; __src = __src + 1) {
      (__src->header).crc = 0;
      uVar3 = (__src->header).length;
      memcpy(buffer + iVar6,__src,(long)(int)uVar3);
      Swap(buffer + (long)iVar6 + 4,uVar3 - 4);
      uVar4 = CRC::ComputeCrc32(0xedb88320,buffer + iVar6,uVar3);
      *(uint *)(buffer + (long)iVar6 + 8) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      iVar6 = iVar6 + uVar3;
    }
    for (paVar5 = (this->list_data_).
                  super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        paVar5 != (this->list_data_).
                  super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
                  _M_impl.super__Vector_impl_data._M_finish; paVar5 = paVar5 + 1) {
      uVar3 = (paVar5->header).length;
      if (3 < uVar3) {
        (paVar5->header).crc = 0;
        lVar7 = (long)iVar6;
        uVar2 = *(undefined8 *)&paVar5->data_crc;
        puVar1 = buffer + iVar6;
        *(undefined8 *)(puVar1 + 0xc) = *(undefined8 *)&paVar5->size;
        *(undefined8 *)(puVar1 + 0x14) = uVar2;
        uVar2 = *(undefined8 *)&(paVar5->header).crc;
        *(undefined8 *)puVar1 = *(undefined8 *)&paVar5->header;
        *(undefined8 *)(puVar1 + 8) = uVar2;
        Swap(puVar1 + 4,0x18);
        memcpy(buffer + (iVar6 + 0x1c),paVar5->buffer,(ulong)paVar5->size);
        iVar6 = iVar6 + 0x1c + paVar5->size;
        uVar3 = CRC::ComputeCrc32(0xedb88320,buffer + lVar7,uVar3);
        *(uint *)(puVar1 + 8) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      }
      if (paVar5->buffer != (uchar *)0x0) {
        operator_delete__(paVar5->buffer);
      }
      paVar5->buffer = (uchar *)0x0;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int CAPSFile::WriteToBuffer(unsigned char* buffer, unsigned int size_of_buffer)
{
   // Write header
   int offset = 0;

   if (size_of_buffer < ComputeSize())
      return -1;

   int size = SwapInt(caps_header_.length);
   memcpy(&buffer[offset], &caps_header_, size);
   offset += size;

   // Write INFO
   size = SwapInt(caps_info_.header.length);
   memcpy(&buffer[offset], &caps_info_, size);
   offset += size;

   // Write IMGE
   for (std::vector<ImgeItem>::iterator it = list_imge_.begin(); it != list_imge_.end(); ++it)
   {
      int base_offset = offset;
      it->header.crc = 0;
      int lg = it->header.length;
      memcpy(&buffer[offset], &(*it), lg);
      Swap(&buffer[offset + 4], lg - 4);
      unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
      memcpy(&buffer[offset + 8], &crc, 4);
      offset += lg;
   }

   // Write DATA
   for (std::vector<DataChunks>::iterator it = list_data_.begin(); it != list_data_.end(); ++it)
   {
      if (it->header.length >= 4)
      {
         // datablock
         int base_offset = offset;
         it->header.crc = 0;
         int lg = it->header.length;

         memcpy(&buffer[offset], &(*it), sizeof(DataChunks) - sizeof(unsigned char*));
         Swap(&buffer[offset + 4], sizeof(DataChunks) - (4+ sizeof(unsigned char*)));
         offset += sizeof(DataChunks) - sizeof(unsigned char*);

         memcpy(&buffer[offset], it->buffer, it->size);
         offset += it->size;

         unsigned int crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, &buffer[base_offset], lg));
         memcpy(&buffer[base_offset + 8], &crc, 4);
      }
      delete[]it->buffer;
      it->buffer = NULL;
   }

   return 0;
}